

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O2

void __thiscall wasm::RemoveUnusedNames::handleBreakTarget(RemoveUnusedNames *this,Name *name)

{
  iterator iVar1;
  
  if ((name->super_IString).str._M_str != (char *)0x0) {
    iVar1 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
            ::find(&(this->branchesSeen)._M_t,name);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->branchesSeen)._M_t._M_impl.super__Rb_tree_header
       ) {
      std::
      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
      ::erase(&(this->branchesSeen)._M_t,name);
      return;
    }
    (name->super_IString).str._M_len = 0;
    (name->super_IString).str._M_str = (char *)0x0;
  }
  return;
}

Assistant:

void handleBreakTarget(Name& name) {
    if (name.is()) {
      if (branchesSeen.find(name) == branchesSeen.end()) {
        name = Name();
      } else {
        branchesSeen.erase(name);
      }
    }
  }